

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O2

deThread deThread_create(deThreadFunc func,void *arg,deThreadAttributes *attributes)

{
  int iVar1;
  pthread_t *__newthread;
  pthread_attr_t attr;
  
  __newthread = (pthread_t *)deCalloc(0x18);
  if (__newthread != (pthread_t *)0x0) {
    __newthread[1] = (pthread_t)func;
    __newthread[2] = (pthread_t)arg;
    iVar1 = pthread_attr_init((pthread_attr_t *)&attr);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
      if (iVar1 == 0) {
        iVar1 = pthread_create(__newthread,(pthread_attr_t *)&attr,startThread,__newthread);
        pthread_attr_destroy((pthread_attr_t *)&attr);
        if (iVar1 == 0) {
          return (deThread)__newthread;
        }
      }
      else {
        pthread_attr_destroy((pthread_attr_t *)&attr);
      }
    }
    deFree(__newthread);
  }
  return 0;
}

Assistant:

deThread deThread_create (deThreadFunc func, void* arg, const deThreadAttributes* attributes)
{
	pthread_attr_t	attr;
	Thread*			thread	= (Thread*)deCalloc(sizeof(Thread));

	if (!thread)
		return 0;

	thread->func	= func;
	thread->arg		= arg;

	if (pthread_attr_init(&attr) != 0)
	{
		deFree(thread);
		return 0;
	}

	/* \todo [2009-11-12 pyry] Map attributes. */
	DE_UNREF(attributes);

	if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE) != 0)
	{
		pthread_attr_destroy(&attr);
		deFree(thread);
		return 0;
	}

	if (pthread_create(&thread->thread, &attr, startThread, thread) != 0)
	{
		pthread_attr_destroy(&attr);
		deFree(thread);
		return 0;
	}
	DE_ASSERT(thread->thread);

	pthread_attr_destroy(&attr);

	return (deThread)thread;
}